

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_fading_colour.c
# Opt level: O0

HRESULT frame_completed(void *context,cdecklink_video_frame_t *frame,
                       DecklinkOutputFrameCompletionResult result)

{
  HRESULT HVar1;
  cdecklink_video_frame_t_conflict *theFrame;
  cdecklink_video_frame_t *next_frame;
  cdecklink_output_t *output;
  DecklinkOutputFrameCompletionResult result_local;
  cdecklink_video_frame_t *frame_local;
  void *context_local;
  
  if (frame != (cdecklink_video_frame_t *)0x0) {
    cdecklink_video_frame_release((cdecklink_video_frame_t_conflict *)frame);
  }
  if (context == (void *)0x0) {
    printf("No output in callback\n");
    context_local._4_4_ = 1;
  }
  else {
    theFrame = (cdecklink_video_frame_t_conflict *)generate_next_frame(context);
    if (theFrame == (cdecklink_video_frame_t_conflict *)0x0) {
      printf("Failed to generate next frame\n");
      context_local._4_4_ = 1;
    }
    else {
      HVar1 = cdecklink_output_schedule_video_frame
                        ((cdecklink_output_t_conflict *)context,theFrame,scheduled,1000,25000);
      if (HVar1 == 0) {
        scheduled = scheduled + 1000;
        context_local._4_4_ = 0;
      }
      else {
        printf("Failed to schedule next frame\n");
        context_local._4_4_ = 1;
      }
    }
  }
  return context_local._4_4_;
}

Assistant:

HRESULT frame_completed(void *context, cdecklink_video_frame_t *frame,
                        DecklinkOutputFrameCompletionResult result) {
//    printf("frame completed\n");

    if (frame != NULL) {
        cdecklink_video_frame_release(frame); // TODO - leaking the mutable wrapper
    }

    if (context == NULL) {
        printf("No output in callback\n");
        return S_FALSE;
    }
    cdecklink_output_t *output = context;

    cdecklink_video_frame_t *next_frame = generate_next_frame(output);
    if (next_frame == NULL) {
        printf("Failed to generate next frame\n");
        return S_FALSE;
    }

    if (cdecklink_output_schedule_video_frame(output, next_frame, scheduled, 1000, 25000) != S_OK) {
        printf("Failed to schedule next frame\n");
        return S_FALSE;
    }

    scheduled += 1000;

    return S_OK;
}